

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_imit_init_cpa(EVP_MD_CTX *ctx)

{
  int iVar1;
  gost_subst_block *in_RDI;
  
  iVar1 = gost_imit_init(ctx,in_RDI);
  return iVar1;
}

Assistant:

static int gost_imit_init_cpa(EVP_MD_CTX *ctx)
{
    return gost_imit_init(ctx, &Gost28147_CryptoProParamSetA);
}